

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::BaseModeFunction<duckdb::ModeStandard<unsigned_char>>::
     Execute<unsigned_char,duckdb::ModeState<unsigned_char,duckdb::ModeStandard<unsigned_char>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_char>>>
               (ModeState<unsigned_char,_duckdb::ModeStandard<unsigned_char>_> *state,uchar *key,
               AggregateInputData *input_data)

{
  ulong uVar1;
  _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar2;
  ulong uVar3;
  
  this = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)state->frequency_map;
  if (this == (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)0x0) {
    this = (_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)ModeStandard<unsigned_char>::CreateEmpty(input_data->allocator);
    state->frequency_map = (Counts *)this;
  }
  pmVar2 = std::__detail::
           _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this,key);
  pmVar2->count = pmVar2->count + 1;
  uVar1 = state->count;
  uVar3 = pmVar2->first_row;
  if (uVar1 <= pmVar2->first_row) {
    uVar3 = uVar1;
  }
  pmVar2->first_row = uVar3;
  state->count = uVar1 + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}